

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_hc.cpp
# Opt level: O3

void crnlib::dxt_hc::determine_color_endpoints::Node::sort_task(uint64 data,void *ptr)

{
  long lVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  
  lVar1 = *ptr;
  lVar2 = *(long *)((long)ptr + 8);
  if (lVar1 != lVar2) {
    uVar4 = (lVar2 - lVar1 >> 2) * 0x6db6db6db6db6db7;
    lVar3 = 0x3f;
    if (uVar4 != 0) {
      for (; uVar4 >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    std::
    __introsort_loop<std::pair<crnlib::vec<6u,float>,unsigned_int>*,long,__gnu_cxx::__ops::_Iter_less_iter>
              (lVar1,lVar2,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<std::pair<crnlib::vec<6u,float>,unsigned_int>*,__gnu_cxx::__ops::_Iter_less_iter>
              (lVar1,lVar2);
    return;
  }
  return;
}

Assistant:

static void sort_task(uint64 data, void* ptr) { std::sort(((Node*)ptr)->p, ((Node*)ptr)->pEnd); }